

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O3

void __thiscall
slang::ast::SFormat::TypeVisitor::visit(TypeVisitor *this,EnumType *type,ConstantValue *arg)

{
  char *begin;
  bool bVar1;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> this_00;
  ConstantValue *lhs;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  string local_40;
  
  sVar2 = Scope::membersOfType<slang::ast::EnumValueSymbol>(&type->super_Scope);
  this_00 = sVar2._M_begin.current;
  do {
    if (this_00.current == sVar2._M_end.current.current) {
      ConstantValue::toString_abi_cxx11_(&local_40,arg,0x80,false,false);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)&this->buffer,local_40._M_dataplus._M_p,
                 local_40._M_dataplus._M_p + local_40._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    lhs = EnumValueSymbol::getValue((EnumValueSymbol *)this_00.current,(SourceRange)ZEXT816(0));
    bVar1 = slang::operator==(lhs,arg);
    if (bVar1) {
      begin = (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.name._M_str;
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)&this->buffer,begin,
                 begin + (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.name
                         ._M_len);
      return;
    }
    do {
      this_00.current =
           (((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.nextInScope;
      if ((EnumValueSymbol *)this_00.current == (EnumValueSymbol *)0x0) {
        this_00.current = (Symbol *)0x0;
        break;
      }
    } while ((((EnumValueSymbol *)this_00.current)->super_ValueSymbol).super_Symbol.kind !=
             EnumValue);
  } while( true );
}

Assistant:

void visit(const EnumType& type, const ConstantValue& arg) {
        for (auto& member : type.values()) {
            if (member.getValue() == arg) {
                buffer.append(member.name);
                return;
            }
        }
        buffer.append(arg.toString());
    }